

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc.c++
# Opt level: O0

ssize_t __thiscall
capnp::_::anon_unknown_0::RpcConnectionState::RpcRequest::send
          (RpcRequest *this,int __fd,void *__buf,size_t __n,int __flags)

{
  ClientHook **__return_storage_ptr__;
  Reader value;
  bool bVar1;
  uint16_t uVar2;
  RpcConnectionState *pRVar3;
  RpcClient *pRVar4;
  Own<capnp::ClientHook> *pOVar5;
  ClientHook *pCVar6;
  uint64_t uVar7;
  RefOrVoid<capnp::_::(anonymous_namespace)::RpcConnectionState> params;
  Own<capnp::_::(anonymous_namespace)::RpcConnectionState::QuestionRef> *params_1;
  Promise<capnp::Response<capnp::AnyPointer>_> *promise;
  Own<capnp::_::(anonymous_namespace)::RpcConnectionState::RpcPipeline> *other;
  size_t __n_00;
  void *__buf_00;
  undefined4 in_register_00000034;
  Exception *this_00;
  int __flags_00;
  MessageSize MVar8;
  Own<capnp::PipelineHook> local_498;
  Pipeline local_488;
  PropagateException local_459;
  ForkedPromise<kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState::RpcResponse>_>
  local_458;
  undefined1 local_448 [8];
  PromiseForResult<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_rpc_c__:1430:13),_kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState::RpcResponse>_>
  appPromise;
  undefined1 local_428 [8];
  Own<capnp::_::(anonymous_namespace)::RpcConnectionState::RpcPipeline> pipeline;
  ForkedPromise<kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState::RpcResponse>_>
  forkedPromise;
  SendInternalResult sendResult;
  Reader local_3e0;
  MessageSize local_3c0;
  Maybe<capnp::MessageSize> local_3b0;
  undefined1 local_398 [8];
  Request<capnp::AnyPointer,_capnp::AnyPointer> replacement;
  Maybe<kj::Own<capnp::ClientHook>_> local_348;
  undefined1 local_338 [8];
  OwnOwn<capnp::ClientHook> redirect;
  Own<capnp::PipelineHook> local_1d0;
  Pipeline local_1c0;
  Exception local_188;
  Promise<capnp::Response<capnp::AnyPointer>_> local_30;
  Exception *local_20;
  Exception *e;
  RpcRequest *this_local;
  
  this_00 = (Exception *)CONCAT44(in_register_00000034,__fd);
  e = this_00;
  this_local = this;
  pRVar3 = kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState>::operator->
                     ((Own<capnp::_::(anonymous_namespace)::RpcConnectionState> *)
                      &(this_00->ownFile).content.size_);
  bVar1 = kj::OneOf<kj::Own<capnp::_::VatNetworkBase::Connection>,kj::Exception>::
          is<kj::Own<capnp::_::VatNetworkBase::Connection>>
                    ((OneOf<kj::Own<capnp::_::VatNetworkBase::Connection>,kj::Exception> *)
                     &pRVar3->connection);
  if (bVar1) {
    pRVar4 = kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState::RpcClient>::operator->
                       ((Own<capnp::_::(anonymous_namespace)::RpcConnectionState::RpcClient> *)
                        &this_00->file);
    rpc::Call::Builder::getTarget((Builder *)&replacement.hook.ptr,(Builder *)(this_00->trace + 2));
    (*(pRVar4->super_ClientHook)._vptr_ClientHook[8])(&local_348);
    kj::_::readMaybe<capnp::ClientHook>((_ *)local_338,&local_348);
    kj::Maybe<kj::Own<capnp::ClientHook>_>::~Maybe(&local_348);
    pOVar5 = kj::_::OwnOwn::operator_cast_to_Own_((OwnOwn *)local_338);
    if (pOVar5 == (Own<capnp::ClientHook> *)0x0) {
      sendInternal((SendInternalResult *)&forkedPromise.hub.ptr,(RpcRequest *)this_00,false);
      kj::Promise<kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState::RpcResponse>_>::fork
                ((Promise<kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState::RpcResponse>_>
                  *)&pipeline.ptr);
      params = kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState>::operator*
                         ((Own<capnp::_::(anonymous_namespace)::RpcConnectionState> *)
                          &(this_00->ownFile).content.size_);
      params_1 = kj::mv<kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState::QuestionRef>>
                           ((Own<capnp::_::(anonymous_namespace)::RpcConnectionState::QuestionRef> *
                            )&forkedPromise.hub.ptr);
      kj::ForkedPromise<kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState::RpcResponse>_>
      ::addBranch((ForkedPromise<kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState::RpcResponse>_>
                   *)&appPromise.super_PromiseBase.node.ptr);
      kj::
      refcounted<capnp::_::(anonymous_namespace)::RpcConnectionState::RpcPipeline,capnp::_::(anonymous_namespace)::RpcConnectionState&,kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState::QuestionRef>,kj::Promise<kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState::RpcResponse>>>
                ((kj *)local_428,params,params_1,
                 (Promise<kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState::RpcResponse>_>
                  *)&appPromise.super_PromiseBase.node.ptr);
      kj::Promise<kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState::RpcResponse>_>::
      ~Promise((Promise<kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState::RpcResponse>_>
                *)&appPromise.super_PromiseBase.node.ptr);
      kj::ForkedPromise<kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState::RpcResponse>_>
      ::addBranch(&local_458);
      kj::Promise<kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState::RpcResponse>>::
      then<capnp::_::(anonymous_namespace)::RpcConnectionState::RpcRequest::send()::_lambda(kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState::RpcResponse>&&)_1_,kj::_::PropagateException>
                ((Promise<kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState::RpcResponse>>
                  *)local_448,(Type *)&local_458,&local_459);
      kj::Promise<kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState::RpcResponse>_>::
      ~Promise((Promise<kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState::RpcResponse>_>
                *)&local_458);
      promise = kj::mv<kj::Promise<capnp::Response<capnp::AnyPointer>>>
                          ((Promise<capnp::Response<capnp::AnyPointer>_> *)local_448);
      other = kj::mv<kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState::RpcPipeline>>
                        ((Own<capnp::_::(anonymous_namespace)::RpcConnectionState::RpcPipeline> *)
                         local_428);
      kj::Own<capnp::PipelineHook>::
      Own<capnp::_::(anonymous_namespace)::RpcConnectionState::RpcPipeline,void>(&local_498,other);
      AnyPointer::Pipeline::Pipeline(&local_488,&local_498);
      RemotePromise<capnp::AnyPointer>::RemotePromise
                ((RemotePromise<capnp::AnyPointer> *)this,promise,&local_488);
      AnyPointer::Pipeline::~Pipeline(&local_488);
      kj::Own<capnp::PipelineHook>::~Own(&local_498);
      kj::Promise<capnp::Response<capnp::AnyPointer>_>::~Promise
                ((Promise<capnp::Response<capnp::AnyPointer>_> *)local_448);
      kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState::RpcPipeline>::~Own
                ((Own<capnp::_::(anonymous_namespace)::RpcConnectionState::RpcPipeline> *)local_428)
      ;
      kj::ForkedPromise<kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState::RpcResponse>_>
      ::~ForkedPromise((ForkedPromise<kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState::RpcResponse>_>
                        *)&pipeline.ptr);
      SendInternalResult::~SendInternalResult((SendInternalResult *)&forkedPromise.hub.ptr);
    }
    else {
      pOVar5 = kj::_::OwnOwn<capnp::ClientHook>::operator->((OwnOwn<capnp::ClientHook> *)local_338);
      pCVar6 = kj::Own<capnp::ClientHook>::get(pOVar5);
      uVar7 = rpc::Call::Builder::getInterfaceId((Builder *)(this_00->trace + 2));
      uVar2 = rpc::Call::Builder::getMethodId((Builder *)(this_00->trace + 2));
      MVar8 = AnyPointer::Builder::targetSize((Builder *)(this_00->trace + 7));
      local_3c0.wordCount = MVar8.wordCount;
      local_3c0.capCount = MVar8.capCount;
      kj::Maybe<capnp::MessageSize>::Maybe(&local_3b0,&local_3c0);
      __n_00 = (size_t)uVar2;
      __flags_00 = (int)&local_3b0;
      (**pCVar6->_vptr_ClientHook)(local_398,pCVar6,uVar7);
      kj::Maybe<capnp::MessageSize>::~Maybe(&local_3b0);
      AnyPointer::Builder::operator_cast_to_Reader(&local_3e0,(Builder *)(this_00->trace + 7));
      value.reader.capTable._0_4_ = (int)local_3e0.reader.capTable;
      value.reader.segment = local_3e0.reader.segment;
      value.reader.capTable._4_4_ = (int)((ulong)local_3e0.reader.capTable >> 0x20);
      value.reader.pointer._0_4_ = (int)local_3e0.reader.pointer;
      value.reader.pointer._4_4_ = (int)((ulong)local_3e0.reader.pointer >> 0x20);
      value.reader.nestingLimit = local_3e0.reader.nestingLimit;
      value.reader._28_4_ = local_3e0.reader._28_4_;
      AnyPointer::Builder::set((Builder *)local_398,value);
      Request<capnp::AnyPointer,_capnp::AnyPointer>::send
                ((Request<capnp::AnyPointer,_capnp::AnyPointer> *)this,(int)local_398,__buf_00,
                 __n_00,__flags_00);
      Request<capnp::AnyPointer,_capnp::AnyPointer>::~Request
                ((Request<capnp::AnyPointer,_capnp::AnyPointer> *)local_398);
    }
    kj::_::OwnOwn<capnp::ClientHook>::~OwnOwn((OwnOwn<capnp::ClientHook> *)local_338);
  }
  else {
    pRVar3 = kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState>::operator->
                       ((Own<capnp::_::(anonymous_namespace)::RpcConnectionState> *)
                        &(this_00->ownFile).content.size_);
    local_20 = kj::OneOf<kj::Own<capnp::_::VatNetworkBase::Connection>,_kj::Exception>::
               get<kj::Exception>(&pRVar3->connection);
    kj::cp<kj::Exception>(&local_188,local_20);
    kj::Promise<capnp::Response<capnp::AnyPointer>_>::Promise(&local_30,&local_188);
    __return_storage_ptr__ = &redirect.value.ptr;
    kj::cp<kj::Exception>((Exception *)__return_storage_ptr__,local_20);
    newBrokenPipeline((capnp *)&local_1d0,(Exception *)__return_storage_ptr__);
    AnyPointer::Pipeline::Pipeline(&local_1c0,&local_1d0);
    RemotePromise<capnp::AnyPointer>::RemotePromise
              ((RemotePromise<capnp::AnyPointer> *)this,&local_30,&local_1c0);
    AnyPointer::Pipeline::~Pipeline(&local_1c0);
    kj::Own<capnp::PipelineHook>::~Own(&local_1d0);
    kj::Exception::~Exception((Exception *)&redirect.value.ptr);
    kj::Promise<capnp::Response<capnp::AnyPointer>_>::~Promise(&local_30);
    kj::Exception::~Exception(&local_188);
  }
  return (ssize_t)this;
}

Assistant:

RemotePromise<AnyPointer> send() override {
      if (!connectionState->connection.is<Connected>()) {
        // Connection is broken.
        const kj::Exception& e = connectionState->connection.get<Disconnected>();
        return RemotePromise<AnyPointer>(
            kj::Promise<Response<AnyPointer>>(kj::cp(e)),
            AnyPointer::Pipeline(newBrokenPipeline(kj::cp(e))));
      }

      KJ_IF_MAYBE(redirect, target->writeTarget(callBuilder.getTarget())) {
        // Whoops, this capability has been redirected while we were building the request!
        // We'll have to make a new request and do a copy.  Ick.

        auto replacement = redirect->get()->newCall(
            callBuilder.getInterfaceId(), callBuilder.getMethodId(), paramsBuilder.targetSize());
        replacement.set(paramsBuilder);
        return replacement.send();
      } else {
        auto sendResult = sendInternal(false);

        auto forkedPromise = sendResult.promise.fork();

        // The pipeline must get notified of resolution before the app does to maintain ordering.
        auto pipeline = kj::refcounted<RpcPipeline>(
            *connectionState, kj::mv(sendResult.questionRef), forkedPromise.addBranch());

        auto appPromise = forkedPromise.addBranch().then(
            [=](kj::Own<RpcResponse>&& response) {
              auto reader = response->getResults();
              return Response<AnyPointer>(reader, kj::mv(response));
            });

        return RemotePromise<AnyPointer>(
            kj::mv(appPromise),
            AnyPointer::Pipeline(kj::mv(pipeline)));
      }